

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::Initialize(cmCPackGenerator *this,string *name,cmMakefile *mf)

{
  bool bVar1;
  int iVar2;
  cmValue filename;
  int iVar3;
  allocator<char> local_41;
  string local_40;
  
  this->MakefileMap = mf;
  std::__cxx11::string::_M_assign((string *)&this->Name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CPACK_GENERATOR",&local_41);
  StoreOption<cmValue>(this,&local_40,(cmValue)&this->Name);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CPACK_PROJECT_CONFIG_FILE",&local_41);
  filename = GetOption(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (filename.Value != (string *)0x0) {
    cmMakefile::ReadListFile(mf,filename.Value);
  }
  iVar2 = (*this->_vptr_cmCPackGenerator[0xf])(this);
  bVar1 = cmSystemTools::GetErrorOccurredFlag();
  iVar3 = 0;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CPACK_PACKAGING_INSTALL_PREFIX",&local_41);
    StoreOptionIfNotSet<char_const*>(this,&local_40,"/");
    std::__cxx11::string::~string((string *)&local_40);
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

int cmCPackGenerator::Initialize(const std::string& name, cmMakefile* mf)
{
  this->MakefileMap = mf;
  this->Name = name;
  // set the running generator name
  this->SetOption("CPACK_GENERATOR", this->Name);
  // Load the project specific config file
  cmValue config = this->GetOption("CPACK_PROJECT_CONFIG_FILE");
  if (config) {
    mf->ReadListFile(config);
  }
  int result = this->InitializeInternal();
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return 0;
  }

  // If a generator subclass did not already set this option in its
  // InitializeInternal implementation, and the project did not already set
  // it, the default value should be:
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/");

  return result;
}